

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Record_Query_R_PDU::Record_Query_R_PDU
          (Record_Query_R_PDU *this,EntityIdentifier *OriginatingEntityID,
          EntityIdentifier *ReceivingEntityID,KUINT32 RequestID,RequiredReliabilityService RRS,
          EventType ET,KUINT32 Time)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,OriginatingEntityID,ReceivingEntityID);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header,RRS);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Record_Query_R_PDU_002292e0;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Record_Query_R_PDU_00229320;
  this->m_ui32RqId = RequestID;
  this->m_ui16EvntTyp = (KUINT16)ET;
  this->m_ui32Time = Time;
  *(undefined8 *)&this->m_ui32NumRecs = 0;
  *(undefined8 *)
   ((long)&(this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = 'A';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\n';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  return;
}

Assistant:

Record_Query_R_PDU::Record_Query_R_PDU( const EntityIdentifier & OriginatingEntityID, const EntityIdentifier & ReceivingEntityID, KUINT32 RequestID,
                                        RequiredReliabilityService RRS, EventType ET, KUINT32 Time ) :
    Simulation_Management_Header( OriginatingEntityID, ReceivingEntityID ),
    Reliability_Header( RRS ),
    m_ui32RqId( RequestID ),
    m_ui16EvntTyp( ET ),
    m_ui32Time( Time ),
    m_ui32NumRecs( 0 )
{
    m_ui8PDUType = RecordQuery_R_PDU_Type;
    m_ui16PDULength = RECORD_QUERY_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}